

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-blows.c
# Opt level: O0

void melee_effect_handler_HALLU(melee_effect_handler_context_t *context)

{
  player *p;
  _Bool _Var1;
  uint32_t uVar2;
  melee_effect_handler_context_t *context_local;
  
  _Var1 = monster_damage_target(context,true);
  if (!_Var1) {
    p = context->p;
    uVar2 = Rand_div(context->rlev / 2);
    _Var1 = player_inc_timed(p,L'\x06',uVar2 + L'\x04',true,true,true);
    if (_Var1) {
      context->obvious = true;
    }
    update_smart_learn(context->mon,context->p,L'\0',L'\0',L'\v');
  }
  return;
}

Assistant:

static void melee_effect_handler_HALLU(melee_effect_handler_context_t *context)
{
	/* Take damage */
	if (monster_damage_target(context, true)) return;

	/* Increase "image" */
	if (player_inc_timed(context->p, TMD_IMAGE,
			3 + randint1(context->rlev / 2), true, true, true))
		context->obvious = true;

	/* Learn about the player */
	update_smart_learn(context->mon, context->p, 0, 0, ELEM_CHAOS);
}